

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall BinaryReaderTest_ReadInt_Test::TestBody(BinaryReaderTest_ReadInt_Test *this)

{
  BinaryReader<mp::internal::IdentityConverter> *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_160;
  AssertionResult gtest_ar_2;
  size_t size;
  int local_13c;
  AssertionResult gtest_ar;
  BinaryReader<mp::internal::EndiannessConverter> local_f8;
  NLStringRef str;
  int data [3];
  TestBinaryReader<mp::internal::IdentityConverter> reader;
  
  data[0] = 0xb;
  data[1] = -0x16;
  data[2] = 0;
  size = 8;
  mp::NLStringRef::NLStringRef(&str,(char *)data,8);
  TestBinaryReader<mp::internal::IdentityConverter>::TestBinaryReader
            (&reader,str,(CStringRef)0x22c559);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_3_ = 0;
  this_00 = &reader.super_BinaryReader<mp::internal::IdentityConverter>;
  local_160.data_._0_4_ =
       mp::internal::BinaryReader<mp::internal::IdentityConverter>::ReadInt<int>(this_00);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"11","reader.ReadInt<int>()",(int *)&gtest_ar_2,(int *)&local_160
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x16e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_3_ = 0xffffff;
  local_160.data_._0_4_ =
       mp::internal::BinaryReader<mp::internal::IdentityConverter>::ReadInt<int>(this_00);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"-22","reader.ReadInt<int>()",(int *)&gtest_ar_2,
             (int *)&local_160);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x16f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar_2.success_ == true) {
    fmt::format<unsigned_long>((string *)&gtest_ar,(CStringRef)0x2103b2,&size);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::BinaryReader<mp::internal::IdentityConverter>::ReadInt<int>(this_00);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_2,
               (char (*) [110])
               "Expected: reader.ReadInt<int>() throws an exception of type mp::BinaryReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  if (gtest_ar_2.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x171,pcVar2);
  testing::internal::AssertHelper::operator=(&local_160,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_160);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  ChangeEndianness<int>(data);
  local_160.data_._0_4_ = 0xb;
  TestBinaryReader<mp::internal::EndiannessConverter>::TestBinaryReader
            ((TestBinaryReader<mp::internal::EndiannessConverter> *)&gtest_ar,str,
             (CStringRef)0x22c559);
  local_13c = mp::internal::BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(&local_f8)
  ;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_2,"11",
             "TestBinaryReader<EndiannessConverter>(str).ReadInt<int>()",(int *)&local_160,
             &local_13c);
  TestBinaryReader<mp::internal::EndiannessConverter>::~TestBinaryReader
            ((TestBinaryReader<mp::internal::EndiannessConverter> *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x173,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  TestBinaryReader<mp::internal::IdentityConverter>::~TestBinaryReader(&reader);
  return;
}

Assistant:

TEST(BinaryReaderTest, ReadInt) {
  int data[] = {11, -22, 0};
  std::size_t size = sizeof(data) - sizeof(int);
  mp::NLStringRef str(reinterpret_cast<char*>(data), size);
  TestBinaryReader<> reader(str);
  EXPECT_EQ(11, reader.ReadInt<int>());
  EXPECT_EQ(-22, reader.ReadInt<int>());
  EXPECT_THROW_MSG(reader.ReadInt<int>(), mp::BinaryReadError,
                   fmt::format("test:offset {}: unexpected end of file", size));
  ChangeEndianness(data[0]);
  EXPECT_EQ(11, TestBinaryReader<EndiannessConverter>(str).ReadInt<int>());
}